

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int BUFFER_fill(BUFFER_HANDLE handle,uchar fill_char)

{
  LOGGER_LOG p_Var1;
  BUFFER *buffer_data;
  size_t index;
  LOGGER_LOG l;
  int result;
  uchar fill_char_local;
  BUFFER_HANDLE handle_local;
  
  if (handle == (BUFFER_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/buffer.c"
                ,"BUFFER_fill",0x259,1,"Invalid parameter specified, handle == NULL.");
    }
    l._0_4_ = 0x25a;
  }
  else {
    for (buffer_data = (BUFFER *)0x0; buffer_data < (BUFFER *)handle->size;
        buffer_data = (BUFFER *)((long)&buffer_data->buffer + 1)) {
      *(uchar *)((long)&buffer_data->buffer + (long)handle->buffer) = fill_char;
    }
    l._0_4_ = 0;
  }
  return (int)l;
}

Assistant:

int BUFFER_fill(BUFFER_HANDLE handle, unsigned char fill_char)
{
    int result;
    if (handle == NULL)
    {
        /* Codes_SRS_BUFFER_07_002: [ If handle is NULL BUFFER_fill shall return a non-zero value. ] */
        LogError("Invalid parameter specified, handle == NULL.");
        result = MU_FAILURE;
    }
    else
    {
        size_t index;
        /* Codes_SRS_BUFFER_07_001: [ BUFFER_fill shall fill the supplied BUFFER_HANDLE with the supplied fill character. ] */
        BUFFER* buffer_data = (BUFFER*)handle;
        for (index = 0; index < buffer_data->size; index++)
        {
            buffer_data->buffer[index] = fill_char;
        }
        result = 0;
    }
    return result;
}